

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void P_TranslatePortalXY(line_t_conflict *src,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  FLinePortal *port_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double ty;
  double tx;
  double nposy;
  double nposx;
  FLinePortal *port;
  double *y_local;
  double *x_local;
  line_t_conflict *src_local;
  
  if ((src != (line_t_conflict *)0x0) &&
     (port_00 = line_t::getPortal((line_t *)src), port_00 != (FLinePortal *)0x0)) {
    if ((port_00->mFlags & 0x10) != 0) {
      SetRotation(port_00);
    }
    dVar1 = *x;
    dVar7 = vertex_t::fX(src->v1);
    dVar2 = *y;
    dVar8 = vertex_t::fY(src->v1);
    dVar3 = port_00->mCosRot;
    dVar4 = port_00->mSinRot;
    dVar5 = port_00->mCosRot;
    dVar6 = port_00->mSinRot;
    dVar9 = vertex_t::fX(port_00->mDestination->v2);
    dVar10 = vertex_t::fY(port_00->mDestination->v2);
    *x = dVar9 + ((dVar1 - dVar7) * dVar3 - (dVar2 - dVar8) * dVar4);
    *y = dVar10 + (dVar2 - dVar8) * dVar5 + (dVar1 - dVar7) * dVar6;
  }
  return;
}

Assistant:

void P_TranslatePortalXY(line_t* src, double& x, double& y)
{
	if (!src) return;
	FLinePortal *port = src->getPortal();
	if (!port) return;
	if (port->mFlags & PORTF_POLYOBJ) SetRotation(port);	// update the angle for polyportals.

	// offsets from line
	double nposx = x - src->v1->fX();
	double nposy = y - src->v1->fY();

	// Rotate position along normal to match exit linedef
	double tx = nposx * port->mCosRot - nposy * port->mSinRot;
	double ty = nposy * port->mCosRot + nposx * port->mSinRot;

	tx += port->mDestination->v2->fX();
	ty += port->mDestination->v2->fY();

	x = tx;
	y = ty;
}